

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O0

void writenumber(uint i,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  int c;
  FILE *fp_local;
  uint i_local;
  
  writebyte((char)(i / 10000) + '0',fp);
  uVar1 = (i % 10000) % 1000;
  writebyte((char)((i % 10000) / 1000) + '0',fp);
  uVar2 = uVar1 % 100;
  writebyte((char)(uVar1 / 100) + '0',fp);
  writebyte((char)(uVar2 / 10) + '0',fp);
  writebyte((char)(uVar2 % 10) + '0',fp);
  return;
}

Assistant:

static void writenumber(unsigned int i, FILE *fp) {
	int c;
	c=i/10000;
	i-=c*10000;
	writebyte(c+48, fp);
	c=i/1000;
	i-=c*1000;
	writebyte(c+48, fp);
	c=i/100;
	i-=c*100;
	writebyte(c+48, fp);
	c=i/10;
	writebyte(c+48, fp);
	i%=10;
	writebyte(i+48, fp);
}